

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::TransformFeedback::FunctionalTest::testTransformFeedbackStatus
          (FunctionalTest *this,GLenum parameter_name,GLint expected_value)

{
  ostringstream *this_00;
  char *pcVar1;
  GLint GVar2;
  int iVar3;
  deUint32 err;
  undefined4 extraout_var;
  char *pcVar4;
  GLint value;
  GLint local_1b4;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1b4 = 0x4cb2f;
  (*this->m_gl_getTransformFeedbackiv)(this->m_xfb_dsa,parameter_name,&local_1b4);
  err = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
  glu::checkError(err,"glGetTransformFeedbackiv call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                  ,0x7af);
  GVar2 = local_1b4;
  if (local_1b4 != expected_value) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,
               "It was expected that glGetTransformFeedbackiv query of parameter ",0x41);
    pcVar4 = "GL_TRANSFORM_FEEDBACK_ACTIVE";
    if (parameter_name == 0x8e23) {
      pcVar4 = "GL_TRANSFORM_FEEDBACK_PAUSED";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar4,0x1c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," shall return ",0xe);
    pcVar4 = "mapped_ == GL_FALSE";
    pcVar1 = "mapped_ == GL_FALSE";
    if (expected_value == 1) {
      pcVar1 = "mapped_ == GL_TRUE";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,pcVar1 + 0xb,(ulong)(expected_value != 1) + 7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"however, ",9);
    if (local_1b4 == 1) {
      pcVar4 = "mapped_ == GL_TRUE";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,pcVar4 + 0xb,(ulong)(local_1b4 != 1) + 7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," was returned.",0xe);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
  }
  return GVar2 == expected_value;
}

Assistant:

bool FunctionalTest::testTransformFeedbackStatus(glw::GLenum parameter_name, glw::GLint expected_value)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Dummy storage. */
	glw::GLint value = 314159;

	/* Test of GetTransformFeedbackiv. */
	m_gl_getTransformFeedbackiv(m_xfb_dsa, parameter_name, &value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTransformFeedbackiv call failed.");

	if (expected_value != value)
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "It was expected that glGetTransformFeedbackiv query of parameter "
			<< ((parameter_name == GL_TRANSFORM_FEEDBACK_PAUSED) ? "GL_TRANSFORM_FEEDBACK_PAUSED" :
																   "GL_TRANSFORM_FEEDBACK_ACTIVE")
			<< " shall return " << ((expected_value == GL_TRUE) ? "GL_TRUE" : "GL_FALSE") << "however, "
			<< ((value == GL_TRUE) ? "GL_TRUE" : "GL_FALSE") << " was returned." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}